

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O0

void __thiscall
cmCPackIFWResourcesParser::cmCPackIFWResourcesParser
          (cmCPackIFWResourcesParser *this,cmCPackIFWInstaller *i)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cmCPackIFWInstaller *local_18;
  cmCPackIFWInstaller *i_local;
  cmCPackIFWResourcesParser *this_local;
  
  local_18 = i;
  i_local = (cmCPackIFWInstaller *)this;
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_cmXMLParser)._vptr_cmXMLParser =
       (_func_int **)&PTR__cmCPackIFWResourcesParser_00ae1e20;
  this->installer = local_18;
  this->file = false;
  std::__cxx11::string::string((string *)&this->path);
  std::__cxx11::string::string((string *)&this->basePath);
  std::operator+(&local_38,&local_18->Directory,"/resources");
  std::__cxx11::string::operator=((string *)&this->path,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

cmCPackIFWResourcesParser(cmCPackIFWInstaller* i)
    : installer(i)
    , file(false)
  {
    this->path = i->Directory + "/resources";
  }